

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.h
# Opt level: O2

void __thiscall BitStreamReader::skipBit(BitStreamReader *this)

{
  uint uVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint *buff;
  
  uVar1 = (this->super_BitStream).m_totalBits;
  if (uVar1 != 0) {
    if (this->m_bitLeft == 0) {
      buff = (this->super_BitStream).m_buffer + 1;
      (this->super_BitStream).m_buffer = buff;
      uVar1 = getCurVal(this,buff);
      this->m_curVal = uVar1;
      uVar1 = (this->super_BitStream).m_totalBits;
      uVar3 = 0x1f;
    }
    else {
      uVar3 = this->m_bitLeft - 1;
    }
    this->m_bitLeft = uVar3;
    (this->super_BitStream).m_totalBits = uVar1 - 1;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00249978;
  __cxa_throw(puVar2,&BitStreamException::typeinfo,std::exception::~exception);
}

Assistant:

void skipBit()
    {
        if (m_totalBits < 1)
            THROW_BITSTREAM_ERR;
        if (m_bitLeft > 0)
            m_bitLeft--;
        else
        {
            m_buffer++;
            m_curVal = getCurVal(m_buffer);
            m_bitLeft = INT_BIT - 1;
        }
        m_totalBits--;
    }